

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int amqpvalue_get_encoded_size(AMQP_VALUE value,size_t *encoded_size)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  int result;
  size_t *encoded_size_local;
  AMQP_VALUE value_local;
  
  if ((value == (AMQP_VALUE)0x0) || (encoded_size == (size_t *)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_get_encoded_size",0x12a0,1,
                "Bad arguments: value = %p, encoded_size = %p",value,encoded_size);
    }
    l._4_4_ = 0x12a1;
  }
  else {
    *encoded_size = 0;
    l._4_4_ = amqpvalue_encode(value,count_bytes,encoded_size);
  }
  return l._4_4_;
}

Assistant:

int amqpvalue_get_encoded_size(AMQP_VALUE value, size_t* encoded_size)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_309: [If any argument is NULL, amqpvalue_get_encoded_size shall return a non-zero value.] */
    if ((value == NULL) ||
        (encoded_size == NULL))
    {
        LogError("Bad arguments: value = %p, encoded_size = %p",
            value, encoded_size);
        result = MU_FAILURE;
    }
    else
    {
        *encoded_size = 0;
        result = amqpvalue_encode(value, count_bytes, encoded_size);
    }

    return result;
}